

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool readFromFile<float,short>(string *fname,TWaveformT<short> *res)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  string *in_RDI;
  streamsize size;
  ifstream fin;
  undefined1 local_248 [16];
  streamoff local_238;
  undefined4 local_230;
  undefined1 local_220 [40];
  streamsize in_stack_fffffffffffffe08;
  int32_t in_stack_fffffffffffffe14;
  TWaveformT<short> *in_stack_fffffffffffffe18;
  ifstream *in_stack_fffffffffffffe20;
  bool local_1;
  
  _Var3 = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(local_220,in_RDI,_Var3);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_1 = false;
  }
  else {
    local_248 = std::istream::tellg();
    local_238 = std::fpos::operator_cast_to_long((fpos *)local_248);
    std::istream::seekg((long)local_220,_S_beg);
    bVar2 = (anonymous_namespace)::readWaveform<float,short>
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14
                       ,in_stack_fffffffffffffe08);
    if (bVar2) {
      std::ifstream::close();
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  local_230 = 1;
  std::ifstream::~ifstream(local_220);
  return local_1;
}

Assistant:

bool readFromFile(const std::string & fname, TWaveformT<TSample> & res) {
    std::ifstream fin(fname, std::ios::binary | std::ios::ate);
    if (fin.good() == false) {
        return false;
    }

    {
        std::streamsize size = fin.tellg();
        fin.seekg(0, std::ios::beg);

        static_assert(std::is_same<TSampleInput, TSampleF>::value, "TSampleInput not supported");
        static_assert(std::is_same<TSample, TSampleF>::value ||
                      std::is_same<TSample, TSampleI16>::value, "TSample not supported");

        if (readWaveform<TSampleInput>(fin, res, 0, size) == false) {
            return false;
        }
    }

    fin.close();

    return true;
}